

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O0

uint64_t __thiscall
BMRS<RemSP>::is_connected(BMRS<RemSP> *this,uint64_t *flag_bits,uint start,uint end)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint64_t cutter_ed;
  uint64_t cutter_st;
  uint i;
  uint64_t cutter;
  uint ed_bits;
  uint ed_base;
  uint st_bits;
  uint st_base;
  uint end_local;
  uint start_local;
  uint64_t *flag_bits_local;
  BMRS<RemSP> *this_local;
  
  if (start == end) {
    this_local = (BMRS<RemSP> *)(flag_bits[start >> 6] & 1L << ((byte)start & 0x3f));
  }
  else {
    uVar1 = start >> 6;
    bVar3 = (byte)start & 0x3f;
    uVar2 = end + 1 >> 6;
    bVar4 = (char)end + 1U & 0x3f;
    cutter_st._4_4_ = uVar1;
    if (uVar1 == uVar2) {
      this_local = (BMRS<RemSP> *)(flag_bits[uVar1] & (-1L << bVar3 ^ -1L << bVar4));
    }
    else {
      do {
        cutter_st._4_4_ = cutter_st._4_4_ + 1;
        if (uVar2 <= cutter_st._4_4_) {
          if ((flag_bits[uVar1] & -1L << bVar3) != 0) {
            return 1;
          }
          if ((flag_bits[uVar2] & (-1L << bVar4 ^ 0xffffffffffffffffU)) != 0) {
            return 1;
          }
          return 0;
        }
      } while (flag_bits[cutter_st._4_4_] == 0);
      this_local = (BMRS<RemSP> *)0x1;
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t is_connected(const uint64_t* flag_bits, unsigned start, unsigned end) {
        if (start == end) return flag_bits[start >> 6] & ((uint64_t)1 << (start & 0x0000003F));

        unsigned st_base = start >> 6;
        unsigned st_bits = start & 0x0000003F;
        unsigned ed_base = (end + 1) >> 6;
        unsigned ed_bits = (end + 1) & 0x0000003F;
        if (st_base == ed_base) {
            uint64_t cutter = (0xFFFFFFFFFFFFFFFF << st_bits) ^ (0xFFFFFFFFFFFFFFFF << ed_bits);
            return flag_bits[st_base] & cutter;
        }

        for (unsigned i = st_base + 1; i < ed_base; i++) {
            if (flag_bits[i]) return true;
        }
        uint64_t cutter_st = 0xFFFFFFFFFFFFFFFF << st_bits;
        uint64_t cutter_ed = ~(0xFFFFFFFFFFFFFFFF << ed_bits);
        if (flag_bits[st_base] & cutter_st) return true;
        if (flag_bits[ed_base] & cutter_ed) return true;
        return false;
    }